

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O1

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  int iVar1;
  CompressorScheme CVar2;
  ChannelData *pCVar3;
  exr_coding_channel_info_t *peVar4;
  uint8_t *puVar5;
  int i;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long alStack_48 [3];
  uint8_t *planarUncBuffer [3];
  
  lVar6 = 0;
  do {
    alStack_48[lVar6] = 0;
    alStack_48[lVar6] = (long)me->_planarUncBuffer[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  iVar1 = me->_numChannels;
  if ((long)iVar1 != 0) {
    lVar6 = 0x1f0;
    lVar7 = 0;
    do {
      pCVar3 = me->_channelData;
      peVar4 = pCVar3[lVar7].chan;
      lVar11 = (long)peVar4->height * (long)peVar4->width;
      lVar12 = (long)peVar4->bytes_per_element;
      sVar9 = lVar11 * lVar12;
      pCVar3[lVar7].planarUncSize = sVar9;
      CVar2 = pCVar3[lVar7].compression;
      puVar5 = (uint8_t *)alStack_48[CVar2];
      pCVar3[lVar7].planarUncBuffer = puVar5;
      pCVar3[lVar7].planarUncBufferEnd = puVar5;
      pCVar3[lVar7].planarUncRle[0] = puVar5;
      pCVar3[lVar7].planarUncRleEnd[0] = puVar5;
      if (1 < lVar12) {
        lVar10 = 0;
        do {
          lVar8 = *(long *)((long)(pCVar3->_dctData)._dctData + lVar10 * 8 + lVar6 + -0x20) + lVar11
          ;
          *(long *)((long)(pCVar3->_dctData)._dctData + lVar10 * 8 + lVar6 + -0x18) = lVar8;
          *(long *)((long)(pCVar3->_dctData)._dctData + lVar10 * 8 + lVar6 + 8) = lVar8;
          lVar10 = lVar10 + 1;
        } while (lVar12 + -1 != lVar10);
      }
      pCVar3[lVar7].planarUncType = (uint)peVar4->data_type;
      if (CVar2 == LOSSY_DCT) {
        pCVar3[lVar7].planarUncType = EXR_PIXEL_FLOAT;
      }
      else {
        alStack_48[CVar2] = (long)(puVar5 + sVar9);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x240;
    } while (lVar7 != iVar1);
  }
  return iVar1;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        for (int byte = 1; byte < curc->bytes_per_element; ++byte)
        {
            cd->planarUncRle[byte] =
                cd->planarUncRle[byte - 1] + curc->width * curc->height;

            cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}